

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserequation.cpp
# Opt level: O3

vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
* __thiscall
libcellml::AnalyserEquation::dependencies
          (vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
           *__return_storage_ptr__,AnalyserEquation *this)

{
  int iVar1;
  pointer pwVar2;
  int iVar3;
  pointer pwVar4;
  bool bVar5;
  shared_ptr<libcellml::AnalyserEquation> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar4 = (this->mPimpl->mDependencies).
           super__Vector_base<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pwVar2 = (this->mPimpl->mDependencies).
           super__Vector_base<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pwVar4 != pwVar2) {
    do {
      local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pwVar4->super___weak_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001cafbb:
        local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
      }
      else {
        iVar3 = (local_30.
                 super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count;
        do {
          if (iVar3 == 0) {
            local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            goto LAB_001cafbb;
          }
          LOCK();
          iVar1 = (local_30.
                   super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count;
          bVar5 = iVar3 == iVar1;
          if (bVar5) {
            (local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count = iVar3 + 1;
            iVar1 = iVar3;
          }
          iVar3 = iVar1;
          UNLOCK();
        } while (!bVar5);
        if ((local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           ((local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count == 0)) goto LAB_001cafbb;
        local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (pwVar4->super___weak_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      }
      std::
      vector<std::shared_ptr<libcellml::AnalyserEquation>,std::allocator<std::shared_ptr<libcellml::AnalyserEquation>>>
      ::emplace_back<std::shared_ptr<libcellml::AnalyserEquation>>
                ((vector<std::shared_ptr<libcellml::AnalyserEquation>,std::allocator<std::shared_ptr<libcellml::AnalyserEquation>>>
                  *)__return_storage_ptr__,&local_30);
      if (local_30.super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.
                   super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pwVar4 = pwVar4 + 1;
    } while (pwVar4 != pwVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AnalyserEquationPtr> AnalyserEquation::dependencies() const
{
    std::vector<AnalyserEquationPtr> res;

    for (const auto &dependency : mPimpl->mDependencies) {
        res.push_back(dependency.lock());
    }

    return res;
}